

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O3

Var Js::JavascriptSet::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  ThreadContext *this;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptSet *pJVar6;
  RecyclableObject *this_00;
  JavascriptMethod p_Var7;
  int in_stack_00000010;
  undefined1 local_90 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  Iterator iterator;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x9e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_48,(CallInfo *)&__tag.entry.next);
  args.super_Arguments.Values =
       (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_90,function,(CallInfo)__tag.entry.next,
             L"Set.prototype.forEach",&stack0x00000000);
  pvVar5 = Arguments::operator[]((Arguments *)local_48,0);
  bVar3 = VarIs<Js::JavascriptSet>(pvVar5);
  if (bVar3) {
    pJVar6 = UnsafeVarTo<Js::JavascriptSet>(pvVar5);
    if (pJVar6 != (JavascriptSet *)0x0) {
      if (((ulong)local_48 & 0xfffffe) != 0) {
        pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
        bVar3 = JavascriptConversion::IsCallable(pvVar5);
        if (bVar3) {
          pvVar5 = Arguments::operator[]((Arguments *)local_48,1);
          this_00 = VarTo<Js::RecyclableObject>(pvVar5);
          if ((local_48._0_4_ & 0xffffff) < 3) {
            iterator.current.ptr =
                 *(MapOrSetDataNode<void_*> **)((long)args.super_Arguments.Values[1] + 0x430);
          }
          else {
            iterator.current.ptr =
                 (MapOrSetDataNode<void_*> *)Arguments::operator[]((Arguments *)local_48,2);
          }
          Memory::Recycler::WBSetBit((char *)&callInfo_local);
          callInfo_local = (CallInfo)&pJVar6->list;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&callInfo_local);
          while( true ) {
            bVar3 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&callInfo_local);
            uVar2 = _DAT_00000010;
            if (!bVar3) {
              pvVar5 = *(Var *)((long)args.super_Arguments.Values[1] + 0x430);
              AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                        ((AutoTagNativeLibraryEntry *)local_90);
              return pvVar5;
            }
            this = (ThreadContext *)args.super_Arguments.Values[0x77];
            bVar3 = this->reentrancySafeOrHandled;
            this->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
            if (*(char *)((long)args.super_Arguments.Values[0x77] + 0x108) == '\x01') break;
            p_Var7 = RecyclableObject::GetEntryPoint(this_00);
            CheckIsExecutable(this_00,p_Var7);
            p_Var7 = RecyclableObject::GetEntryPoint(this_00);
            pvVar5 = Arguments::operator[]((Arguments *)local_48,0);
            (*p_Var7)(this_00,(CallInfo)this_00,0x2000004,0,0,0,0,0x2000004,iterator.current.ptr,
                      uVar2,uVar2,pvVar5);
            this->reentrancySafeOrHandled = bVar3;
          }
          Throw::FatalJsReentrancyError();
        }
      }
      JavascriptError::ThrowTypeError
                ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec34,L"Set.prototype.forEach");
    }
  }
  JavascriptError::ThrowTypeErrorVar
            ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec04,L"Set.prototype.forEach",
             L"Set");
}

Assistant:

Var JavascriptSet::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Set.prototype.forEach"));

    JavascriptSet* set = JavascriptOperators::TryFromVar<JavascriptSet>(args[0]);
    if (set == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set.prototype.forEach"), _u("Set"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Set.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = set->GetIterator();

    while (iterator.Next())
    {
        Var value = iterator.Current();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, value, args[0]);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}